

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QTime __thiscall QTime::fromString(QTime *this,QString *string,QStringView format)

{
  bool bVar1;
  long in_FS_OFFSET;
  QStringView newFormat;
  QDateTimeParser dt;
  QLocale local_e0;
  QCalendar local_d8;
  QDateTimeParser local_d0;
  QTime local_34;
  long local_30;
  
  newFormat.m_data = (storage_type_conflict *)format.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34.mds = -1;
  memset(&local_d0,0xaa,0x98);
  QCalendar::QCalendar(&local_d8);
  QDateTimeParser::QDateTimeParser(&local_d0,QTime,FromString,local_d8);
  QLocale::QLocale(&local_e0,C,AnyScript,AnyCountry);
  QLocale::operator=(&local_d0.defaultLocale,&local_e0);
  QLocale::~QLocale(&local_e0);
  newFormat.m_size = (qsizetype)string;
  bVar1 = QDateTimeParser::parseFormat(&local_d0,newFormat);
  if (bVar1) {
    QDateTimeParser::fromString(&local_d0,(QString *)this,(QDate *)0x0,&local_34,0x76c);
  }
  QDateTimeParser::~QDateTimeParser(&local_d0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QTime)local_34.mds;
  }
  __stack_chk_fail();
}

Assistant:

QTime QTime::fromString(const QString &string, QStringView format)
{
    QTime time;
#if QT_CONFIG(datetimeparser)
    QDateTimeParser dt(QMetaType::QTime, QDateTimeParser::FromString, QCalendar());
    dt.setDefaultLocale(QLocale::c());
    if (dt.parseFormat(format))
        dt.fromString(string, nullptr, &time);
#else
    Q_UNUSED(string);
    Q_UNUSED(format);
#endif
    return time;
}